

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cc
# Opt level: O1

IntegralConvertResult
absl::str_format_internal::FormatConvertImpl
          (char *v,FormatConversionSpecImpl conv,FormatSinkImpl *sink)

{
  bool bVar1;
  char *pcVar2;
  size_t sVar3;
  FormatSinkImpl *in_R8;
  FormatConversionSpecImpl conv_00;
  string_view value;
  string_view v_00;
  
  conv_00._0_4_ = conv.precision_;
  if (conv.conv_ == p) {
    conv_00.width_ = 0;
    conv_00.precision_ = (int)sink;
    FormatConvertImpl((str_format_internal *)v,(VoidPtr)conv._0_8_,conv_00,in_R8);
  }
  else {
    if (v == (char *)0x0) {
      sVar3 = 0;
    }
    else if ((int)conv_00._0_4_ < 0) {
      sVar3 = strlen(v);
    }
    else {
      pcVar2 = std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                         (v,v + conv_00._0_4_);
      sVar3 = (long)pcVar2 - (long)v;
    }
    if (conv.flags_ != kBasic) {
      value._M_str = v;
      value._M_len = sVar3;
      bVar1 = FormatSinkImpl::PutPaddedString
                        (sink,value,conv.width_,conv_00._0_4_,(bool)(conv.flags_ & kLeft));
      return (IntegralConvertResult)bVar1;
    }
    v_00._M_str = v;
    v_00._M_len = sVar3;
    FormatSinkImpl::Append(sink,v_00);
  }
  return (IntegralConvertResult)true;
}

Assistant:

StringPtrConvertResult FormatConvertImpl(const char* v,
                                         const FormatConversionSpecImpl conv,
                                         FormatSinkImpl* sink) {
  if (conv.conversion_char() == FormatConversionCharInternal::p)
    return {FormatConvertImpl(VoidPtr(v), conv, sink).value};
  size_t len;
  if (v == nullptr) {
    len = 0;
  } else if (conv.precision() < 0) {
    len = std::strlen(v);
  } else {
    // If precision is set, we look for the NUL-terminator on the valid range.
    len = static_cast<size_t>(std::find(v, v + conv.precision(), '\0') - v);
  }
  return {ConvertStringArg(string_view(v, len), conv, sink)};
}